

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

TimingPathSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::TimingPathSymbol,slang::SourceLocation,slang::ast::TimingPathSymbol::ConnectionKind&,slang::ast::TimingPathSymbol::Polarity&,slang::ast::TimingPathSymbol::Polarity&,slang::ast::EdgeKind&>
          (BumpAllocator *this,SourceLocation *args,ConnectionKind *args_1,Polarity *args_2,
          Polarity *args_3,EdgeKind *args_4)

{
  TimingPathSymbol *pTVar1;
  undefined8 in_RCX;
  TimingPathSymbol *in_RDX;
  SourceLocation in_RSI;
  BumpAllocator *in_R8;
  size_t in_R9;
  size_t in_stack_ffffffffffffffc8;
  
  pTVar1 = (TimingPathSymbol *)allocate(in_R8,in_R9,in_stack_ffffffffffffffc8);
  ast::TimingPathSymbol::TimingPathSymbol
            (in_RDX,in_RSI,(ConnectionKind)((ulong)in_RCX >> 0x20),(Polarity)in_RCX,
             (Polarity)((ulong)in_R8 >> 0x20),(EdgeKind)in_R8);
  return pTVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }